

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  undefined1 *puVar1;
  byte *pbVar2;
  alpnid aVar3;
  curl_trc_feat *pcVar4;
  altsvcinfo *asi;
  ConnectBits CVar5;
  Curl_easy *pCVar6;
  byte bVar7;
  _Bool _Var8;
  int iVar9;
  size_t max;
  byte *pbVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  alpnid id;
  byte *pbVar16;
  uint uVar17;
  byte *__s;
  CURLcode CVar18;
  bool bVar19;
  bool bVar20;
  char *ptr;
  curl_off_t portparse;
  byte *local_50;
  Curl_easy *local_48;
  byte *local_40;
  char *local_38;
  
  pCVar6 = data;
  if (conn_to_host == (curl_slist *)0x0) {
    bVar20 = true;
    bVar19 = false;
LAB_001658db:
    asi = data->asi;
    if (((asi != (altsvcinfo *)0x0) && (!bVar19)) && (bVar20)) {
      if (conn->handler->protocol != 2) {
        return CURLE_OK;
      }
      portparse = 0;
      pcVar11 = (conn->host).rawalloc;
      id = ALPN_none;
      _Var8 = false;
      if ((((data->state).http_neg.wanted & 1) != 0) &&
         (id = ALPN_none, ((data->state).http_neg.field_0x3 & 8) == 0)) {
        id = ALPN_h1;
        _Var8 = Curl_altsvc_lookup(asi,ALPN_h1,pcVar11,conn->remote_port,(altsvc **)&portparse,
                                   (uint)(data->state).http_neg.allowed << 3 & (uint)asi->flags & 8)
        ;
      }
      if (_Var8 != false) {
        pcVar12 = (*Curl_cstrdup)(*(char **)(portparse + 0x10));
        if (pcVar12 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->conn_to_host).rawalloc = pcVar12;
        (conn->conn_to_host).name = pcVar12;
        CVar5 = conn->bits;
        conn->bits = (ConnectBits)((ulong)CVar5 | 0x100);
        conn->conn_to_port = (uint)*(ushort *)(portparse + 0x18);
        conn->bits = (ConnectBits)((ulong)CVar5 | 0x380);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar13 = Curl_alpnid2str(id);
          local_50 = (byte *)CONCAT44(local_50._4_4_,conn->remote_port);
          pcVar14 = Curl_alpnid2str(*(alpnid *)(portparse + 0x1c));
          Curl_infof(data,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar13,pcVar11,
                     (ulong)local_50 & 0xffffffff,pcVar14,pcVar12,
                     (ulong)*(ushort *)(portparse + 0x18));
        }
        aVar3 = *(alpnid *)(portparse + 0x1c);
        if (id != aVar3) {
          if (aVar3 == ALPN_h3) {
            conn->transport = '\x05';
            (data->state).http_neg.wanted = '\x04';
            (data->state).http_neg.allowed = '\x04';
          }
          else if (aVar3 == ALPN_h2) {
            (data->state).http_neg.wanted = '\x02';
            (data->state).http_neg.allowed = '\x02';
          }
          else if (aVar3 == ALPN_h1) {
            (data->state).http_neg.wanted = '\x01';
            (data->state).http_neg.allowed = '\x01';
            puVar1 = &(data->state).http_neg.field_0x3;
            *puVar1 = *puVar1 & 0xf7;
          }
        }
      }
    }
    return CURLE_OK;
  }
LAB_00165439:
  local_48 = pCVar6;
  ptr = conn_to_host->data;
  if (*ptr == ':') {
    ptr = ptr + 1;
    bVar19 = true;
LAB_001654ee:
    bVar20 = true;
    if (bVar19) {
      if (*ptr == ':') {
        ptr = ptr + 1;
        bVar20 = false;
      }
      else {
        pcVar11 = strchr(ptr,0x3a);
        if (pcVar11 != (char *)0x0) {
          iVar9 = Curl_str_number(&ptr,&portparse,0xffff);
          bVar20 = true;
          if (iVar9 == 0) {
            bVar20 = portparse != conn->remote_port;
          }
          ptr = pcVar11 + 1;
        }
      }
    }
    uVar17 = 0xffffffff;
    if ((((bVar20) || (!bVar19)) || (ptr == (char *)0x0)) || (*ptr == '\0')) {
      pcVar11 = (char *)0x0;
      CVar18 = CURLE_OK;
      goto LAB_00165735;
    }
    pbVar10 = (byte *)(*Curl_cstrdup)(ptr);
    pCVar6 = local_48;
    if (pbVar10 == (byte *)0x0) goto LAB_00165629;
    pbVar16 = pbVar10;
    __s = pbVar10;
    if (*pbVar10 == 0x5b) {
      pbVar16 = pbVar10 + 1;
      bVar7 = pbVar10[1];
      __s = pbVar16;
      if (bVar7 != 0) {
        __s = pbVar10 + 2;
LAB_001655cb:
        if (((byte)(bVar7 - 0x30) < 10) ||
           ((bVar7 - 0x2e < 0x39 &&
            ((0x1f8000001f81001U >> ((ulong)(bVar7 - 0x2e) & 0x3f) & 1) != 0)))) goto LAB_001655ec;
        if (bVar7 == 0x25) {
          iVar9 = strncmp("%25",(char *)(__s + -1),3);
          if (((pCVar6 != (Curl_easy *)0x0) && (iVar9 != 0)) &&
             ((((pCVar6->set).field_0x89f & 0x40) != 0 &&
              ((pcVar4 = (pCVar6->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
               (0 < pcVar4->log_level)))))) {
            Curl_infof(pCVar6,"Please URL encode %% as %%25, see RFC 6874.");
          }
          bVar7 = *__s;
          while ((bVar7 != 0 &&
                 (((((byte)(bVar7 - 0x30) < 10 || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) ||
                   (bVar7 - 0x2d < 2)) || ((bVar7 == 0x7e || (bVar7 == 0x5f))))))) {
            pbVar2 = __s + 1;
            __s = __s + 1;
            bVar7 = *pbVar2;
          }
          goto LAB_001655fa;
        }
        goto LAB_001655f7;
      }
      goto LAB_001655fa;
    }
    goto LAB_00165661;
  }
  bVar19 = (*(uint *)&conn->bits >> 10 & 1) == 0;
  pcVar11 = "[";
  if (bVar19) {
    pcVar11 = "";
  }
  pcVar12 = "]";
  if (bVar19) {
    pcVar12 = "";
  }
  bVar19 = false;
  pcVar11 = curl_maprintf("%s%s%s",pcVar11,(conn->host).name,pcVar12);
  if (pcVar11 != (char *)0x0) {
    max = strlen(pcVar11);
    iVar9 = curl_strnequal(ptr,pcVar11,max);
    (*Curl_cfree)(pcVar11);
    if (iVar9 == 0) {
      bVar19 = false;
    }
    else {
      bVar19 = ptr[max] == ':';
    }
    ptr = ptr + max + 1;
  }
  if (pcVar11 != (char *)0x0) goto LAB_001654ee;
LAB_00165629:
  CVar18 = CURLE_OUT_OF_MEMORY;
  uVar17 = 0xffffffff;
  pcVar11 = (char *)0x0;
  goto LAB_00165735;
LAB_001655ec:
  bVar7 = *__s;
  __s = __s + 1;
  if (bVar7 == 0) goto LAB_001655f7;
  goto LAB_001655cb;
LAB_001655f7:
  __s = __s + -1;
LAB_001655fa:
  if (*__s == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else if (((pCVar6 != (Curl_easy *)0x0) && (((pCVar6->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar4 = (pCVar6->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
           ))) {
    Curl_infof(pCVar6,"Invalid IPv6 address format");
  }
LAB_00165661:
  local_50 = pbVar10;
  local_40 = pbVar16;
  pcVar11 = strchr((char *)__s,0x3a);
  CVar18 = CURLE_OK;
  uVar15 = 0xffffffff;
  if ((pcVar11 == (char *)0x0) || (*pcVar11 = '\0', pcVar11[1] == '\0')) {
LAB_001656fa:
    pcVar11 = (*Curl_cstrdup)((char *)local_40);
    uVar17 = -(uint)(pcVar11 == (char *)0x0) | uVar15;
    if (pcVar11 == (char *)0x0) {
      CVar18 = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    local_38 = pcVar11 + 1;
    iVar9 = Curl_str_number(&local_38,&portparse,0xffff);
    if (iVar9 == 0) {
      CVar18 = CURLE_OK;
      iVar9 = 0;
      uVar15 = (uint)portparse;
    }
    else {
      Curl_failf(local_48,"No valid port number in connect to host string (%s)",pcVar11 + 1);
      iVar9 = 10;
      CVar18 = CURLE_SETOPT_OPTION_SYNTAX;
      uVar15 = 0xffffffff;
    }
    uVar17 = 0xffffffff;
    if (iVar9 != 10) {
      pcVar11 = (char *)0x0;
      if (iVar9 != 0) goto LAB_00165735;
      goto LAB_001656fa;
    }
    pcVar11 = (char *)0x0;
  }
  (*Curl_cfree)(local_50);
LAB_00165735:
  data = local_48;
  if (CVar18 != CURLE_OK) {
    return CVar18;
  }
  if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfe;
    (*Curl_cfree)(pcVar11);
    bVar19 = false;
  }
  else {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 1;
    (conn->conn_to_host).rawalloc = pcVar11;
    (conn->conn_to_host).name = pcVar11;
    bVar19 = true;
    if (((local_48 != (Curl_easy *)0x0) && (((local_48->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar4 = (local_48->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
       )) {
      Curl_infof(local_48,"Connecting to hostname: %s",pcVar11);
    }
  }
  if ((int)uVar17 < 0) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfd;
    uVar17 = 0xffffffff;
  }
  else {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 2;
    conn->conn_to_port = uVar17;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
      Curl_infof(data,"Connecting to port: %d",(ulong)uVar17);
    }
  }
  conn_to_host = conn_to_host->next;
  bVar20 = uVar17 == 0xffffffff;
  if ((conn_to_host == (curl_slist *)0x0 || bVar19) || (pCVar6 = local_48, uVar17 != 0xffffffff))
  goto LAB_001658db;
  goto LAB_00165439;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef DEBUGBUILD
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid = ALPN_none;
    bool hit = FALSE;
    struct altsvc *as = NULL;
    int allowed_alpns = ALPN_none;
    struct http_negotiation *neg = &data->state.http_neg;

    DEBUGF(infof(data, "Alt-svc check wanted=%x, allowed=%x",
                 neg->wanted, neg->allowed));
#ifdef USE_HTTP3
    if(neg->allowed & CURL_HTTP_V3x)
      allowed_alpns |= ALPN_h3;
#endif
#ifdef USE_HTTP2
    if(neg->allowed & CURL_HTTP_V2x)
      allowed_alpns |= ALPN_h2;
#endif
    if(neg->allowed & CURL_HTTP_V1x)
      allowed_alpns |= ALPN_h1;
    allowed_alpns &= (int)data->asi->flags;

    host = conn->host.rawalloc;
    DEBUGF(infof(data, "check Alt-Svc for host %s", host));
#ifdef USE_HTTP3
    if(!hit && (neg->wanted & CURL_HTTP_V3x)) {
      srcalpnid = ALPN_h3;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h3, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
 #ifdef USE_HTTP2
    if(!hit && (neg->wanted & CURL_HTTP_V2x) &&
       !neg->h2_prior_knowledge) {
      srcalpnid = ALPN_h2;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h2, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
    if(!hit && (neg->wanted & CURL_HTTP_V1x) &&
       !neg->only_10) {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h1, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }

    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          neg->wanted = neg->allowed = CURL_HTTP_V1x;
          neg->only_10 = FALSE;
          break;
        case ALPN_h2:
          neg->wanted = neg->allowed = CURL_HTTP_V2x;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          neg->wanted = neg->allowed = CURL_HTTP_V3x;
          break;
        default: /* should not be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}